

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase183::run(TestCase183 *this)

{
  void *pvVar1;
  void *pvVar2;
  void *pvVar3;
  void *pvVar4;
  Arena arena;
  unsigned_long local_58 [2];
  Arena local_48;
  
  Arena::Arena(&local_48,0x400);
  pvVar1 = Arena::allocateBytes(&local_48,1,1,false);
  pvVar2 = Arena::allocateBytes(&local_48,8,8,false);
  pvVar3 = Arena::allocateBytes(&local_48,1,1,false);
  pvVar4 = Arena::allocateBytes(&local_48,8,1,false);
  if ((long)pvVar3 - (long)pvVar1 != 0x10 && _::Debug::minSeverity < 3) {
    local_58[1] = 0x10;
    local_58[0] = (long)pvVar3 - (long)pvVar1;
    _::Debug::log<char_const(&)[84],unsigned_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
               ,0xbf,ERROR,
               "\"failed: expected \" \"(alignof(long) + sizeof(long)) == (implicitCast<size_t>(&c2 - &c))\", alignof(long) + sizeof(long), implicitCast<size_t>(&c2 - &c)"
               ,(char (*) [84])
                "failed: expected (alignof(long) + sizeof(long)) == (implicitCast<size_t>(&c2 - &c))"
               ,local_58 + 1,local_58);
  }
  if (_::Debug::minSeverity < 3 && (long)pvVar2 - (long)pvVar1 != 8) {
    local_58[1] = 8;
    local_58[0] = (long)pvVar2 - (long)pvVar1;
    _::Debug::log<char_const(&)[93],unsigned_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
               ,0xc0,ERROR,
               "\"failed: expected \" \"(alignof(long)) == (implicitCast<size_t>(reinterpret_cast<char*>(&l) - &c))\", alignof(long), implicitCast<size_t>(reinterpret_cast<char*>(&l) - &c)"
               ,(char (*) [93])
                "failed: expected (alignof(long)) == (implicitCast<size_t>(reinterpret_cast<char*>(&l) - &c))"
               ,local_58 + 1,local_58);
  }
  if (((long)pvVar4 - (long)pvVar3 != 1) && (_::Debug::minSeverity < 3)) {
    local_58[1] = 1;
    local_58[0] = (long)pvVar4 - (long)pvVar3;
    _::Debug::log<char_const(&)[77],unsigned_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
               ,0xc1,ERROR,
               "\"failed: expected \" \"(sizeof(char)) == (implicitCast<size_t>(arr.begin() - &c2))\", sizeof(char), implicitCast<size_t>(arr.begin() - &c2)"
               ,(char (*) [77])
                "failed: expected (sizeof(char)) == (implicitCast<size_t>(arr.begin() - &c2))",
               local_58 + 1,local_58);
  }
  Arena::~Arena(&local_48);
  return;
}

Assistant:

TEST(Arena, Alignment) {
  Arena arena;

  char& c = arena.allocate<char>();
  long& l = arena.allocate<long>();
  char& c2 = arena.allocate<char>();
  ArrayPtr<char> arr = arena.allocateArray<char>(8);

  EXPECT_EQ(alignof(long) + sizeof(long), implicitCast<size_t>(&c2 - &c));
  EXPECT_EQ(alignof(long), implicitCast<size_t>(reinterpret_cast<char*>(&l) - &c));
  EXPECT_EQ(sizeof(char), implicitCast<size_t>(arr.begin() - &c2));
}